

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# san.c
# Opt level: O3

move_t SAN_parse_move(chess_state_t *state,char *san)

{
  char cVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  size_t sVar7;
  char *pcVar8;
  char *pcVar9;
  uint uVar10;
  byte bVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  byte bVar15;
  uint uVar16;
  uint uVar17;
  bool bVar18;
  move_t moves [256];
  move_t local_438 [258];
  
  sVar7 = strlen(san);
  uVar16 = (uint)sVar7;
  uVar3 = STATE_generate_moves_simple(state,local_438);
  cVar1 = *san;
  bVar15 = 1;
  switch(cVar1) {
  case 'K':
  case 'O':
    iVar4 = strncmp(san,"O-O-O",5);
    if (iVar4 != 0) {
      uVar12 = 5;
      uVar17 = 5;
      if ((cVar1 != 'O') || (san[1] != '-')) break;
      bVar11 = 0;
      if (san[2] == 'O') {
        if ((int)uVar3 < 1) {
          return 0;
        }
        uVar14 = 0;
        do {
          if ((local_438[uVar14] & 0x3c0000) == 0x80000) {
            return local_438[uVar14];
          }
          uVar14 = uVar14 + 1;
        } while (uVar3 != uVar14);
        return 0;
      }
      goto LAB_00104b55;
    }
    if (0 < (int)uVar3) {
      uVar14 = 0;
      do {
        if ((local_438[uVar14] & 0x3c0000) == 0xc0000) {
          return local_438[uVar14];
        }
        uVar14 = uVar14 + 1;
      } while (uVar3 != uVar14);
    }
    goto LAB_00104dca;
  case 'L':
  case 'M':
  case 'P':
switchD_00104ab9_caseD_4c:
    bVar11 = 1;
    uVar12 = 0;
    bVar15 = 0;
    goto LAB_00104b55;
  case 'N':
    uVar17 = 1;
    break;
  case 'Q':
    uVar17 = 4;
    break;
  case 'R':
    uVar17 = 3;
    break;
  default:
    if (cVar1 != 'B') goto switchD_00104ab9_caseD_4c;
    uVar17 = 2;
  }
  uVar12 = uVar17;
  bVar11 = 0;
LAB_00104b55:
  pcVar8 = strchr(san,0x78);
  uVar17 = uVar16;
  if ((5 < (int)uVar16 & bVar11 & pcVar8 != (char *)0x0) == 1) {
    iVar4 = strcmp(san + ((ulong)(uVar16 & 0x7fffffff) - 5)," e.p.");
    uVar17 = uVar16 - 5;
    if (iVar4 != 0) {
      uVar17 = uVar16;
    }
  }
  if (san[(long)(int)uVar17 + -1] == '+') {
    uVar17 = uVar17 - 1;
  }
  if (san[(long)(int)uVar17 + -1] == '#') {
    uVar17 = uVar17 - 1;
  }
  uVar16 = 0;
  if ((bVar11 != 0) && (pcVar9 = strchr(san,0x3d), pcVar9 != (char *)0x0)) {
    bVar2 = san[(long)(int)uVar17 + -1];
    if (bVar2 < 0x51) {
      if (bVar2 == 0x42) {
        uVar16 = 2;
      }
      else {
        uVar16 = 1;
        if (bVar2 != 0x4e) {
          return 0;
        }
      }
    }
    else if (bVar2 == 0x51) {
      uVar16 = 4;
    }
    else {
      if (bVar2 != 0x52) {
        return 0;
      }
      uVar16 = 3;
    }
    uVar17 = uVar17 - 2;
  }
  iVar4 = uVar17 - 2;
  if (pcVar8 != (char *)0x0) {
    iVar4 = uVar17 - 3;
  }
  uVar5 = 0xffffffff;
  uVar6 = 0xffffffff;
  if ((byte)(bVar15 & 1 < iVar4 | 0 < iVar4 & bVar11) == 1) {
    uVar10 = 0xffffffff;
    uVar13 = iVar4 - (uint)(bVar11 ^ 1);
    if (uVar13 != 0) {
      uVar14 = 0;
      do {
        bVar15 = san[uVar14 + (bVar11 ^ 1)] + 0x9f;
        if (bVar15 < 8) {
          uVar10 = (uint)bVar15;
        }
        else {
          bVar15 = san[uVar14 + (bVar11 ^ 1)] - 0x31;
          uVar6 = uVar5;
          if (bVar15 < 8) {
            uVar6 = (uint)bVar15;
            uVar5 = (uint)bVar15;
          }
        }
        uVar14 = uVar14 + 1;
      } while (uVar13 != uVar14);
    }
  }
  else {
    uVar10 = 0xffffffff;
  }
  if ((int)uVar3 < 1) {
LAB_00104dca:
    uVar3 = 0;
  }
  else {
    uVar14 = 0;
    uVar5 = 0;
    iVar4 = 0;
    do {
      uVar13 = local_438[uVar14];
      if ((((((uVar13 >> 0xc & 7) == uVar12) &&
            ((pcVar8 != (char *)0x0) != ((uVar13 >> 0x14 & 1) == 0))) &&
           ((uVar16 == 0 || (uVar16 == ((uVar13 >> 0x12 & 0xb) - 7 & (int)(uVar13 << 10) >> 0x1f))))
           ) && ((uVar13 >> 6 & 0x3f) ==
                 ((int)san[(long)(int)uVar17 + -2] + san[(long)(int)uVar17 + -1] * 8) - 0x1e9U)) &&
         ((((int)uVar6 < 0 || ((uVar13 >> 3 & 7) == uVar6)) &&
          (bVar18 = (uVar13 & 7) == uVar10, iVar4 = iVar4 + (uint)(bVar18 || (int)uVar10 < 0),
          bVar18 || (int)uVar10 < 0)))) {
        uVar5 = uVar13;
      }
      uVar14 = uVar14 + 1;
    } while (uVar3 != uVar14);
    uVar3 = 0;
    if (iVar4 == 1) {
      uVar3 = uVar5;
    }
  }
  return uVar3;
}

Assistant:

move_t SAN_parse_move(const chess_state_t *state, const char *san)
{
    move_t moves[256];
    move_t candidate = 0;
    move_t num_candidates = 0;
    int num_moves;
    int i;
    int len;
    int is_capture = 0;
    int promotion_type = 0;
    int type = PAWN;
    int pos_to = 0;
    int rank = -1;
    int file = -1;
    
    len = (int)strlen(san);
    
    /* Generate all possible moves */
    num_moves = STATE_generate_moves_simple(state, moves);
    
    /* What type of piece is moving? */
    switch(san[0]) {
    case 'N':
        type = KNIGHT;
        break;
    case 'B':
        type = BISHOP;
        break;
    case 'R':
        type = ROOK;
        break;
    case 'Q':
        type = QUEEN;
        break;
    case 'K':
    case 'O':
        type = KING;
        break;
    default:
        type = PAWN;
        break;
    }
    
    if(type == KING) {
        /* Is this a kingside castling? */
        if(strncmp(san, "O-O-O", 5) == 0) {
            for(i = 0; i < num_moves; i++) {
                if(MOVE_GET_SPECIAL_FLAGS(moves[i]) == MOVE_QUEEN_CASTLE) {
                    return moves[i];
                }
            }
            /* Failure */
            return 0;
        }
        
        /* Is this a queenside castling? */
        if(strncmp(san, "O-O", 3) == 0) {
            for(i = 0; i < num_moves; i++) {
                if(MOVE_GET_SPECIAL_FLAGS(moves[i]) == MOVE_KING_CASTLE) {
                    return moves[i];
                }
            }
            /* Failure */
            return 0;
        }
    }
    
    /* Is this move a capture? */
    is_capture = (strchr(san, 'x') != 0);
    
    /* Is this move an en passant capture? */
    if(type == PAWN && is_capture && len > 5) {
        if(strcmp(san+len-5, " e.p.") == 0) {
            len -= 5;
        }
    }
    
    /* Is this move a check? */
    if(san[len-1] == '+') {
        len -= 1;
    }

    /* Is this move a check mate? */
    if(san[len-1] == '#') {
        len -= 1;
    }
    
    /* Is this move a pawn promotion? */
    if(type == PAWN && strchr(san, '=')) {
        /* To what piece? */
        switch(san[len-1]) {
        case 'N':
            promotion_type = KNIGHT;
            break;
        case 'B':
            promotion_type = BISHOP;
            break;
        case 'R':
            promotion_type = ROOK;
            break;
        case 'Q':
            promotion_type = QUEEN;
            break;
        default:
        /* Failure */
            return 0;
        }
        
        len -= 2;
    }
    
    /* To what square is the piece moving? */
    pos_to = (san[len-2]-'a') + (san[len-1]-'1') * 8;
    len -= 2;
    
    if(is_capture) {
        len -= 1;
    }
    
    /* Check from file/rank/square */
    if((type == PAWN && len > 0 ) || (type != PAWN && len > 1)) {
        const char *s = san;
        if(type != PAWN) {
            s += 1;
            len -= 1;
        }
        
        for(i = 0; i < len; i++) {
            if(s[i] >= 'a' && s[i] <= 'h') {
                file = s[i] - 'a';
            } else if(s[i] >= '1' && s[i] <= '8') {
                rank = s[i] - '1';
            }
        }
    }

    /* Find candidate move */
    for(i = 0; i < num_moves; i++) {
        int pos_from;
        move_t move = moves[i];
        
        if(MOVE_GET_TYPE(move) != type) continue;
        if((MOVE_IS_CAPTURE(move) != 0) != is_capture) continue;
        if(promotion_type && promotion_type != MOVE_PROMOTION_TYPE(move)) continue;
        if(MOVE_GET_POS_TO(move) != pos_to) continue;
        pos_from = MOVE_GET_POS_FROM(move);
        if(rank >= 0 && pos_from / 8 != rank) continue;
        if(file >= 0 && pos_from % 8 != file) continue;

        num_candidates++;
        candidate = move;
    }

    if(num_candidates == 1) {
        return candidate;
    } else {
        /* Failure */
        return 0;
    }
}